

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolver_sync.c
# Opt level: O0

DNSRESOLVER_HANDLE dns_resolver_create(char *hostname,int port,DNSRESOLVER_OPTIONS *options)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int ms_result;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  DNSRESOLVER_INSTANCE *result;
  DNSRESOLVER_OPTIONS *options_local;
  int port_local;
  char *hostname_local;
  
  if (hostname == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/dns_resolver_sync.c"
                ,"dns_resolver_create",0x32,1,"NULL hostname");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)calloc(1,0x20);
    if ((char **)l == (char **)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/dns_resolver_sync.c"
                  ,"dns_resolver_create",0x3b,1,"malloc instance failed");
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      *(undefined1 *)((long)l + 0x10) = 0;
      *(undefined1 *)((long)l + 0x11) = 0;
      *(int *)((long)l + 8) = port;
      iVar1 = mallocAndStrcpy_s((char **)l,hostname);
      if (iVar1 != 0) {
        free(l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return l;
}

Assistant:

DNSRESOLVER_HANDLE dns_resolver_create(const char* hostname, int port, const DNSRESOLVER_OPTIONS* options)
{
    /* Codes_SRS_dns_resolver_30_012: [ The optional options parameter shall be ignored. ]*/
    DNSRESOLVER_INSTANCE* result;
    (void)options;
    if (hostname == NULL)
    {
        /* Codes_SRS_dns_resolver_30_011: [ If the hostname parameter is NULL, dns_resolver_create shall log an error and return NULL. ]*/
        LogError("NULL hostname");
        result = NULL;
    }
    else
    {
        result = calloc(1, sizeof(DNSRESOLVER_INSTANCE));
        if (result == NULL)
        {
            /* Codes_SRS_dns_resolver_30_014: [ On any failure, dns_resolver_create shall log an error and return NULL. ]*/
            LogError("malloc instance failed");
            result = NULL;
        }
        else
        {
            int ms_result;
            result->is_complete = false;
            result->is_failed = false;
            result->port = port;
            /* Codes_SRS_dns_resolver_30_010: [ dns_resolver_create shall make a copy of the hostname parameter to allow immediate deletion by the caller. ]*/
            ms_result = mallocAndStrcpy_s(&result->hostname, hostname);
            if (ms_result != 0)
            {
                /* Codes_SRS_dns_resolver_30_014: [ On any failure, dns_resolver_create shall log an error and return NULL. ]*/
                free(result);
                result = NULL;
            }
        }
    }
    return result;
}